

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::CompactHandler::CompactHandler
          (CompactHandler *this,CompactStyle compactStyle,Locale *locale,char *nsName,
          CompactType compactType,PluralRules *rules,MutablePatternModifier *buildReference,
          MicroPropsGenerator *parent,UErrorCode *status)

{
  (this->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
       (_func_int **)&PTR__CompactHandler_003f2cf8;
  this->rules = rules;
  this->parent = parent;
  (this->precomputedMods).ptr = (this->precomputedMods).stackArray;
  (this->precomputedMods).capacity = 0xc;
  (this->precomputedMods).needToRelease = '\0';
  this->precomputedModsLength = 0;
  (this->data).super_MultiplierProducer._vptr_MultiplierProducer =
       (_func_int **)&PTR__MultiplierProducer_003f2cd0;
  memset((this->data).patterns,0,0x311);
  (this->data).isEmpty = '\x01';
  ParsedPatternInfo::ParsedPatternInfo(&this->unsafePatternInfo);
  CompactData::populate(&this->data,locale,nsName,compactStyle,compactType,status);
  if (buildReference != (MutablePatternModifier *)0x0) {
    precomputeAllModifiers(this,buildReference,status);
  }
  this->safe = buildReference != (MutablePatternModifier *)0x0;
  return;
}

Assistant:

CompactHandler::CompactHandler(CompactStyle compactStyle, const Locale &locale, const char *nsName,
                               CompactType compactType, const PluralRules *rules,
                               MutablePatternModifier *buildReference, const MicroPropsGenerator *parent,
                               UErrorCode &status)
        : rules(rules), parent(parent) {
    data.populate(locale, nsName, compactStyle, compactType, status);
    if (buildReference != nullptr) {
        // Safe code path
        precomputeAllModifiers(*buildReference, status);
        safe = TRUE;
    } else {
        // Unsafe code path
        safe = FALSE;
    }
}